

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O1

bool __thiscall
Remapper::remap_uav(Remapper *this,D3DUAVBinding *binding,VulkanUAVBinding *vk_binding)

{
  uint uVar1;
  uint uVar2;
  dxil_spv_bool dVar3;
  bool bVar4;
  dxil_spv_uav_vulkan_binding c_vk_binding;
  dxil_spv_uav_d3d_binding c_binding;
  dxil_spv_uav_vulkan_binding local_78;
  dxil_spv_uav_d3d_binding local_28;
  
  if (this->uav_remapper == (dxil_spv_uav_remapper_cb)0x0) {
    (vk_binding->buffer_binding).bindless.use_heap = false;
    (vk_binding->counter_binding).bindless.use_heap = false;
    uVar1 = (binding->binding).register_space;
    (vk_binding->buffer_binding).descriptor_set = uVar1;
    uVar2 = (binding->binding).register_index;
    (vk_binding->buffer_binding).binding = uVar2;
    (vk_binding->counter_binding).descriptor_set = uVar1 + 1;
    (vk_binding->counter_binding).binding = uVar2;
    (vk_binding->buffer_binding).descriptor_type = Identity;
    (vk_binding->counter_binding).descriptor_type = Identity;
    (vk_binding->offset_binding).descriptor_set = 0;
    (vk_binding->offset_binding).binding = 0;
    (vk_binding->offset_binding).root_constant_index = 0;
    (vk_binding->offset_binding).bindless.heap_root_offset = 0;
    *(undefined8 *)&(vk_binding->offset_binding).bindless.use_heap = 0;
    bVar4 = true;
  }
  else {
    local_28.d3d_binding.stage = (binding->binding).stage;
    local_28.d3d_binding.kind = (dxil_spv_resource_kind)(binding->binding).kind;
    local_28.d3d_binding.resource_index = (binding->binding).resource_index;
    local_28.d3d_binding.register_space = (binding->binding).register_space;
    local_28.d3d_binding.register_index = (binding->binding).register_index;
    local_28.d3d_binding.range_size = (binding->binding).range_size;
    local_28.d3d_binding.alignment = (binding->binding).alignment;
    local_28.has_counter = binding->counter;
    local_78.offset_binding.set = 0;
    local_78.offset_binding.binding = 0;
    local_78.offset_binding.root_constant_index = 0;
    local_78.offset_binding.bindless.heap_root_offset = 0;
    local_78.counter_binding.root_constant_index = 0;
    local_78.counter_binding.bindless.heap_root_offset = 0;
    local_78.counter_binding.bindless.use_heap = '\0';
    local_78.counter_binding.bindless._5_3_ = 0;
    local_78.counter_binding.descriptor_type = DXIL_SPV_VULKAN_DESCRIPTOR_TYPE_IDENTITY;
    local_78.buffer_binding.bindless.use_heap = '\0';
    local_78.buffer_binding.bindless._5_3_ = 0;
    local_78.buffer_binding.descriptor_type = DXIL_SPV_VULKAN_DESCRIPTOR_TYPE_IDENTITY;
    local_78.counter_binding.set = 0;
    local_78.counter_binding.binding = 0;
    local_78.buffer_binding.set = 0;
    local_78.buffer_binding.binding = 0;
    local_78.buffer_binding.root_constant_index = 0;
    local_78.buffer_binding.bindless.heap_root_offset = 0;
    local_78.offset_binding.bindless.use_heap = '\0';
    local_78.offset_binding.bindless._5_3_ = 0;
    local_78.offset_binding.descriptor_type = DXIL_SPV_VULKAN_DESCRIPTOR_TYPE_IDENTITY;
    dVar3 = (*this->uav_remapper)(this->uav_userdata,&local_28,&local_78);
    bVar4 = dVar3 == '\x01';
    if (bVar4) {
      (vk_binding->buffer_binding).descriptor_set = local_78.buffer_binding.set;
      (vk_binding->buffer_binding).binding = local_78.buffer_binding.binding;
      (vk_binding->buffer_binding).root_constant_index = local_78.buffer_binding.root_constant_index
      ;
      (vk_binding->buffer_binding).bindless.use_heap =
           local_78.buffer_binding.bindless.use_heap != '\0';
      (vk_binding->buffer_binding).bindless.heap_root_offset =
           local_78.buffer_binding.bindless.heap_root_offset;
      (vk_binding->buffer_binding).descriptor_type = local_78.buffer_binding.descriptor_type;
      (vk_binding->counter_binding).descriptor_set = local_78.counter_binding.set;
      (vk_binding->counter_binding).binding = local_78.counter_binding.binding;
      (vk_binding->counter_binding).root_constant_index =
           local_78.counter_binding.root_constant_index;
      (vk_binding->counter_binding).bindless.use_heap =
           local_78.counter_binding.bindless.use_heap != '\0';
      (vk_binding->counter_binding).bindless.heap_root_offset =
           local_78.counter_binding.bindless.heap_root_offset;
      (vk_binding->counter_binding).descriptor_type = local_78.counter_binding.descriptor_type;
      (vk_binding->offset_binding).descriptor_set = local_78.offset_binding.set;
      (vk_binding->offset_binding).binding = local_78.offset_binding.binding;
      (vk_binding->offset_binding).root_constant_index = local_78.offset_binding.root_constant_index
      ;
      (vk_binding->offset_binding).bindless.use_heap =
           local_78.offset_binding.bindless.use_heap != '\0';
      (vk_binding->offset_binding).bindless.heap_root_offset =
           local_78.offset_binding.bindless.heap_root_offset;
      (vk_binding->offset_binding).descriptor_type = local_78.offset_binding.descriptor_type;
    }
  }
  return bVar4;
}

Assistant:

bool remap_uav(const D3DUAVBinding &binding, VulkanUAVBinding &vk_binding) override
	{
		if (uav_remapper)
		{
			const dxil_spv_uav_d3d_binding c_binding = {
				{ static_cast<dxil_spv_shader_stage>(binding.binding.stage),
				  static_cast<dxil_spv_resource_kind>(binding.binding.kind), binding.binding.resource_index,
				  binding.binding.register_space, binding.binding.register_index, binding.binding.range_size,
				  binding.binding.alignment },
				binding.counter ? DXIL_SPV_TRUE : DXIL_SPV_FALSE
			};

			dxil_spv_uav_vulkan_binding c_vk_binding = {};
			if (uav_remapper(uav_userdata, &c_binding, &c_vk_binding) == DXIL_SPV_TRUE)
			{
				copy_buffer_binding(vk_binding.buffer_binding, c_vk_binding.buffer_binding);
				copy_buffer_binding(vk_binding.counter_binding, c_vk_binding.counter_binding);
				copy_buffer_binding(vk_binding.offset_binding, c_vk_binding.offset_binding);
				return true;
			}
			else
				return false;
		}
		else
		{
			vk_binding.buffer_binding.bindless.use_heap = false;
			vk_binding.counter_binding.bindless.use_heap = false;
			vk_binding.buffer_binding.descriptor_set = binding.binding.register_space;
			vk_binding.buffer_binding.binding = binding.binding.register_index;
			vk_binding.counter_binding.descriptor_set = binding.binding.register_space + 1;
			vk_binding.counter_binding.binding = binding.binding.register_index;
			vk_binding.buffer_binding.descriptor_type = VulkanDescriptorType::Identity;
			vk_binding.counter_binding.descriptor_type = VulkanDescriptorType::Identity;
			vk_binding.offset_binding = {};
			return true;
		}
	}